

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

Normalizer * __thiscall CoreML::Specification::Model::mutable_normalizer(Model *this)

{
  PipelineClassifier *this_00;
  
  if (this->_oneof_case_[0] == 0x25f) {
    this_00 = (this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x25f;
    this_00 = (PipelineClassifier *)operator_new(0x18);
    Normalizer::Normalizer((Normalizer *)this_00);
    (this->Type_).normalizer_ = (Normalizer *)this_00;
  }
  return (Normalizer *)this_00;
}

Assistant:

inline ::CoreML::Specification::Normalizer* Model::mutable_normalizer() {
  if (!has_normalizer()) {
    clear_Type();
    set_has_normalizer();
    Type_.normalizer_ = new ::CoreML::Specification::Normalizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.normalizer)
  return Type_.normalizer_;
}